

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BroadcastBufferDescriptor.h
# Opt level: O0

void aeron::concurrent::broadcast::BroadcastBufferDescriptor::checkCapacity(index_t capacity)

{
  bool bVar1;
  IllegalStateException *this;
  char *pcVar2;
  int in_EDI;
  allocator *filename;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  int local_4;
  
  local_4 = in_EDI;
  bVar1 = util::BitUtil::isPowerOfTwo<int>(in_EDI);
  if (!bVar1) {
    this = (IllegalStateException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_48,local_4);
    std::operator+(&local_28,"capacity must be a positive power of 2 + TRAILER_LENGTH: capacity=",
                   &local_48);
    filename = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,
               "void aeron::concurrent::broadcast::BroadcastBufferDescriptor::checkCapacity(util::index_t)"
               ,filename);
    pcVar2 = util::past_prefix((char *)this,(char *)filename);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,pcVar2,&local_a1);
    util::IllegalStateException::IllegalStateException(this,&local_28,&local_78,&local_a0,0x27);
    __cxa_throw(this,&util::IllegalStateException::typeinfo,
                util::IllegalStateException::~IllegalStateException);
  }
  return;
}

Assistant:

inline static void checkCapacity(util::index_t capacity)
{
    if (!util::BitUtil::isPowerOfTwo(capacity))
    {
        throw util::IllegalStateException(
            "capacity must be a positive power of 2 + TRAILER_LENGTH: capacity=" + std::to_string(capacity),
            SOURCEINFO);
    }
}